

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_version_negotiation_packet(quicly_conn_t *conn,quicly_decoded_packet_t *packet)

{
  ptls_iovec_t reason_phrase;
  uint8_t *puVar1;
  long *in_RSI;
  ptls_iovec_t pVar2;
  uint32_t supported_version;
  uint32_t selected_version;
  uint8_t *end;
  uint8_t *src;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  uint32_t in_stack_ffffffffffffffd0;
  int iVar3;
  uint8_t *local_20 [3];
  int local_4;
  
  local_20[0] = (uint8_t *)(*in_RSI + in_RSI[0xc]);
  puVar1 = (uint8_t *)(*in_RSI + in_RSI[1]);
  iVar3 = 0;
  if ((local_20[0] == puVar1) || (((long)puVar1 - (long)local_20[0]) % 4 != 0)) {
    local_4 = 0x2000a;
  }
  else {
    while (local_20[0] != puVar1) {
      in_stack_ffffffffffffffbc = quicly_decode32(local_20);
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffbc;
      if (in_stack_ffffffffffffffbc == 0xff00001b) {
        if (iVar3 == 0) {
          iVar3 = -0xffffe5;
        }
      }
      else if (in_stack_ffffffffffffffbc == 0xff00001d) {
        iVar3 = -0xffffe3;
      }
    }
    if (iVar3 == 0) {
      pVar2 = ptls_iovec_init("",0);
      reason_phrase.base._4_4_ = iVar3;
      reason_phrase.base._0_4_ = in_stack_ffffffffffffffd0;
      reason_phrase.len = (size_t)puVar1;
      local_4 = handle_close((quicly_conn_t *)pVar2.len,pVar2.base._4_4_,
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             reason_phrase);
    }
    else {
      local_4 = negotiate_using_version
                          ((quicly_conn_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
  }
  return local_4;
}

Assistant:

static int handle_version_negotiation_packet(quicly_conn_t *conn, quicly_decoded_packet_t *packet)
{
    const uint8_t *src = packet->octets.base + packet->encrypted_off, *end = packet->octets.base + packet->octets.len;
    uint32_t selected_version = 0;

    if (src == end || (end - src) % 4 != 0)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    /* select in the precedence of _CURRENT -> _DRAFT27 -> fail */
    while (src != end) {
        uint32_t supported_version = quicly_decode32(&src);
        switch (supported_version) {
        case QUICLY_PROTOCOL_VERSION_CURRENT:
            selected_version = QUICLY_PROTOCOL_VERSION_CURRENT;
            break;
        case QUICLY_PROTOCOL_VERSION_DRAFT27:
            if (selected_version == 0)
                selected_version = QUICLY_PROTOCOL_VERSION_DRAFT27;
            break;
        }
    }
    if (selected_version == 0)
        return handle_close(conn, QUICLY_ERROR_NO_COMPATIBLE_VERSION, UINT64_MAX, ptls_iovec_init("", 0));

    return negotiate_using_version(conn, selected_version);
}